

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O2

QByteArray * __thiscall
EnumDef::qualifiedType(QByteArray *__return_storage_ptr__,EnumDef *this,ClassDef *cdef)

{
  bool bVar1;
  qsizetype qVar2;
  ClassDef *this_00;
  long in_FS_OFFSET;
  QByteArrayView bv;
  QStringBuilder<QStringBuilder<const_QByteArray_&,_const_char_(&)[3]>,_const_QByteArray_&> local_40
  ;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = operator==(&this->name,(QByteArray *)cdef);
  this_00 = cdef;
  if (bVar1) {
    this_00 = (ClassDef *)&(cdef->super_BaseDef).qualified;
    qVar2 = QByteArrayView::lengthHelperCharArray("::",3);
    bv.m_data = "::";
    bv.m_size = qVar2;
    bVar1 = QByteArray::contains((QByteArray *)this_00,bv);
    if (!bVar1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        QArrayDataPointer<char>::QArrayDataPointer
                  (&__return_storage_ptr__->d,(QArrayDataPointer<char> *)this);
        return __return_storage_ptr__;
      }
      goto LAB_0011c35a;
    }
  }
  local_40.a.a = (QByteArray *)this_00;
  local_40.a.b = (char (*) [3])0x133777;
  local_40.b = &this->name;
  QStringBuilder<QStringBuilder<const_QByteArray_&,_const_char_(&)[3]>,_const_QByteArray_&>::
  convertTo<QByteArray>(__return_storage_ptr__,&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
LAB_0011c35a:
  __stack_chk_fail();
}

Assistant:

QByteArray EnumDef::qualifiedType(const ClassDef *cdef) const
{
    if (name == cdef->classname) {
        // The name of the enclosing namespace is the same as the enum class name
        if (cdef->qualified.contains("::")) {
            // QTBUG-112996, fully qualify by using cdef->qualified to disambiguate enum
            // class name and enclosing namespace, e.g.:
            // namespace A { namespace B { Q_NAMESPACE; enum class B { }; Q_ENUM_NS(B) } }
            return cdef->qualified % "::" % name;
        } else {
            // Just "B"; otherwise the compiler complains about the type "B::B" inside
            // "B::staticMetaObject" in the generated code; e.g.:
            // namespace B { Q_NAMESPACE; enum class B { }; Q_ENUM_NS(B) }
            return name;
        }
    }
    return cdef->classname % "::" % name;
}